

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O3

Integer ma_nelem(Pointer address,ulongi length,Integer datatype)

{
  bool bVar1;
  Pointer address_00;
  ulongi nbytes;
  Pointer client_space;
  ulong local_40;
  ulongi local_38;
  
  if (0x58 < length) {
    address_00 = (Pointer)((length - 0x58) / (ulong)(long)ma_sizeof[datatype]);
    if ((long)address_00 < 1) {
      return (Integer)address_00;
    }
    do {
      balloc_after((AR *)datatype,address_00,(Pointer *)address,&local_38);
      if (local_40 <= length) {
        return (Integer)address_00;
      }
      bVar1 = 1 < (long)address_00;
      address_00 = address_00 + -1;
    } while (bVar1);
  }
  return 0;
}

Assistant:

private Integer ma_nelem(address, length, datatype)
    Pointer    address;    /* location of hypothetical block */
    ulongi    length;        /* length of hypothetical block */
    Integer    datatype;    /* of elements in hypothetical block */
{
    AR        ar;        /* allocation request */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for ar */

    if (length <= BLOCK_OVERHEAD_FIXED)
        /* no point in computing anything */
        return (Integer)0;

    /* compute initial request */
    ar.datatype = datatype;
    ar.nelem = (length - BLOCK_OVERHEAD_FIXED) / ma_sizeof[datatype];

    /* make requests until one succeeds or we give up */
    while (ar.nelem > 0)
    {
        /* perform trial allocation to determine size */
        balloc_after(&ar, address, &client_space, &nbytes);

        if (nbytes > length)
            /* not enough space for ar.nelem elements */
            ar.nelem--;
        else
            /* enough space for ar.nelem elements */
            break;
    }

    /* return the result */
    return ar.nelem;
}